

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

UINT8 ym2203_timer_over(void *chip,UINT8 c)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,c) == 0) {
    ym2203_update_req(chip);
    TimerAOver((FM_ST *)((long)chip + 0x110));
    if ((*(uint *)((long)chip + 0x130) & 0xc0) == 0x80) {
      CSMKeyControl((FM_OPN *)((long)chip + 0x108),(FM_CH *)((long)chip + 0x49a8));
    }
  }
  else {
    TimerBOver((FM_ST *)((long)chip + 0x110));
  }
  return *(UINT8 *)((long)chip + 0x12d);
}

Assistant:

UINT8 ym2203_timer_over(void *chip,UINT8 c)
{
	YM2203 *F2203 = (YM2203 *)chip;

	if( c )
	{   /* Timer B */
		TimerBOver( &(F2203->OPN.ST) );
	}
	else
	{   /* Timer A */
		ym2203_update_req(F2203);
		/* timer update */
		TimerAOver( &(F2203->OPN.ST) );
		/* CSM mode key,TL control */
		if ((F2203->OPN.ST.mode & 0xc0) == 0x80)
		{   /* CSM mode total level latch and auto key on */
			CSMKeyControl( &F2203->OPN, &(F2203->CH[2]) );
		}
	}
	return F2203->OPN.ST.irq;
}